

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

int Js::JavascriptString::IndexOf
              (ArgumentReader *args,ScriptContext *scriptContext,char16 *apiNameForErrorMsg,
              bool isRegExpAnAllowedArg)

{
  int iVar1;
  BOOL BVar2;
  int iVar3;
  Var pvVar4;
  int *piVar5;
  char16 *searchStr_00;
  char16 *inputStr_00;
  char *pcVar6;
  bool bVar7;
  Boyer_Moore_Jump local_278;
  bool fAsciiJumpTable;
  JmpTable jmpTable;
  int local_6c;
  int i;
  char16 *inputStr;
  char16 *searchStr;
  int local_50;
  int result;
  charcount_t local_48;
  int position;
  int searchLen;
  int len;
  JavascriptString *searchString;
  JavascriptString *pThis;
  char16 *pcStack_28;
  bool isRegExpAnAllowedArg_local;
  char16 *apiNameForErrorMsg_local;
  ScriptContext *scriptContext_local;
  ArgumentReader *args_local;
  
  pThis._7_1_ = isRegExpAnAllowedArg;
  pcStack_28 = apiNameForErrorMsg;
  apiNameForErrorMsg_local = (char16 *)scriptContext;
  scriptContext_local = (ScriptContext *)args;
  GetThisAndSearchStringArguments
            (args,scriptContext,apiNameForErrorMsg,&searchString,(JavascriptString **)&searchLen,
             isRegExpAnAllowedArg);
  position = GetLength(searchString);
  local_48 = GetLength(_searchLen);
  result = 0;
  if (2 < ((uint)(scriptContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo & 0xffffff))
  {
    pvVar4 = Arguments::operator[]((Arguments *)scriptContext_local,2);
    BVar2 = Js::JavascriptOperators::IsUndefinedObject(pvVar4);
    if (BVar2 == 0) {
      pvVar4 = Arguments::operator[]((Arguments *)scriptContext_local,2);
      result = ConvertToIndex(pvVar4,(ScriptContext *)apiNameForErrorMsg_local);
      local_50 = 0;
      piVar5 = max<int>(&result,&local_50);
      piVar5 = min<int>(piVar5,&position);
      result = *piVar5;
    }
    else {
      result = 0;
    }
  }
  iVar1 = result;
  if (local_48 == 0) {
    args_local._4_4_ = result;
  }
  else {
    searchStr._4_4_ = -1;
    iVar3 = GetLengthAsSignedInt(searchString);
    if (iVar1 < iVar3) {
      searchStr_00 = GetString(_searchLen);
      inputStr_00 = GetString(searchString);
      if (local_48 == 1) {
        local_6c = result;
        while( true ) {
          bVar7 = false;
          if (local_6c < position) {
            bVar7 = inputStr_00[local_6c] != *searchStr_00;
          }
          if (!bVar7) break;
          local_6c = local_6c + 1;
        }
        if (local_6c < position) {
          searchStr._4_4_ = local_6c;
        }
      }
      else {
        bVar7 = BuildLastCharForwardBoyerMooreTable(&local_278,searchStr_00,local_48);
        if (bVar7) {
          searchStr._4_4_ =
               IndexOfUsingJmpTable(&local_278,inputStr_00,position,searchStr_00,local_48,result);
        }
        else {
          pcVar6 = strstr((char *)searchString,(char *)_searchLen);
          searchStr._4_4_ = (int)pcVar6;
        }
      }
    }
    args_local._4_4_ = searchStr._4_4_;
  }
  return args_local._4_4_;
}

Assistant:

int JavascriptString::IndexOf(ArgumentReader& args, ScriptContext* scriptContext, const char16* apiNameForErrorMsg, bool isRegExpAnAllowedArg)
    {
        // The algorithm steps in the spec are the same between String.prototype.indexOf and
        // String.prototype.includes, except that includes returns true if an index is found,
        // false otherwise.  Share the implementation between these two APIs.
        //
        // 1.  Call CheckObjectCoercible passing the this value as its argument.
        // 2.  Let S be the result of calling ToString, giving it the this value as its argument.
        // 3.  Let searchStr be ToString(searchString).
        // 4.  Let pos be ToInteger(position). (If position is undefined, this step produces the value 0).
        // 5.  Let len be the number of characters in S.
        // 6.  Let start be min(max(pos, 0), len).
        // 7.  Let searchLen be the number of characters in searchStr.
        // 8.  Return the smallest possible integer k not smaller than start such that k+ searchLen is not greater than len, and for all nonnegative integers j less than searchLen, the character at position k+j of S is the same as the character at position j of searchStr); but if there is no such integer k, then return the value -1.
        // NOTE
        // The indexOf function is intentionally generic; it does not require that its this value be a String object. Therefore, it can be transferred to other kinds of objects for use as a method.
        //

        JavascriptString * pThis;
        JavascriptString * searchString;

        GetThisAndSearchStringArguments(args, scriptContext, apiNameForErrorMsg, &pThis, &searchString, isRegExpAnAllowedArg);

        int len = pThis->GetLength();
        int searchLen = searchString->GetLength();

        int position = 0;

        if (args.Info.Count > 2)
        {
            if (JavascriptOperators::IsUndefinedObject(args[2]))
            {
                position = 0;
            }
            else
            {
                position = ConvertToIndex(args[2], scriptContext); // this is to adjust corner cases like MAX_VALUE
                position = min(max(position, 0), len);  // adjust position within string limits
            }
        }

        // Zero length search strings are always found at the current search position
        if (searchLen == 0)
        {
            return position;
        }

        int result = -1;

        if (position < pThis->GetLengthAsSignedInt())
        {
            const char16* searchStr = searchString->GetString();
            const char16* inputStr = pThis->GetString();
            if (searchLen == 1)
            {
                int i = position;
                for(; i < len && inputStr[i] != *searchStr ; i++);
                if (i < len)
                {
                    result = i;
                }
            }
            else
            {
                JmpTable jmpTable;
                bool fAsciiJumpTable = BuildLastCharForwardBoyerMooreTable(jmpTable, searchStr, searchLen);
                if (!fAsciiJumpTable)
                {
                    result = JavascriptString::strstr(pThis, searchString, false, position);
                }
                else
                {
                    result = IndexOfUsingJmpTable(jmpTable, inputStr, len, searchStr, searchLen, position);
                }
            }
        }
        return result;
    }